

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               SumState<duckdb::hugeint_t> *state,idx_t count,ValidityMask *mask,
               SelectionVector *sel_vector)

{
  bool bVar1;
  AggregateUnaryInput *in_RCX;
  AggregateInputData *in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  SelectionVector *in_R9;
  idx_t i_1;
  idx_t i;
  AggregateUnaryInput input;
  AggregateUnaryInput *local_58;
  AggregateUnaryInput *in_stack_ffffffffffffffb0;
  AggregateUnaryInput *idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  SumState<duckdb::hugeint_t> *in_stack_ffffffffffffffc0;
  
  AggregateUnaryInput::AggregateUnaryInput
            ((AggregateUnaryInput *)&stack0xffffffffffffffb8,in_RSI,(ValidityMask *)in_R8);
  bVar1 = BaseSumOperation<duckdb::SumSetOperation,_duckdb::HugeintAdd>::IgnoreNull();
  if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8), bVar1)) {
    for (local_58 = (AggregateUnaryInput *)0x0; local_58 < in_RCX;
        local_58 = (AggregateUnaryInput *)((long)&local_58->input + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)local_58);
      BaseSumOperation<duckdb::SumSetOperation,duckdb::HugeintAdd>::
      Operation<duckdb::hugeint_t,duckdb::SumState<duckdb::hugeint_t>,duckdb::HugeintSumOperation>
                (in_stack_ffffffffffffffc0,(hugeint_t *)in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0);
    }
  }
  else {
    for (idx = (AggregateUnaryInput *)0x0; idx < in_RCX;
        idx = (AggregateUnaryInput *)((long)&idx->input + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)idx);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_stack_ffffffffffffffb8,(idx_t)idx)
      ;
      if (bVar1) {
        BaseSumOperation<duckdb::SumSetOperation,duckdb::HugeintAdd>::
        Operation<duckdb::hugeint_t,duckdb::SumState<duckdb::hugeint_t>,duckdb::HugeintSumOperation>
                  (in_stack_ffffffffffffffc0,(hugeint_t *)in_stack_ffffffffffffffb8,idx);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}